

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void groupConcatStep(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  sqlite3_str *p;
  sqlite3 *psVar2;
  uchar *puVar3;
  bool bVar4;
  int local_5c;
  int nA;
  int i;
  int *pnsl;
  int firstTerm;
  sqlite3 *db;
  int nSep;
  int nVal;
  char *zSep;
  GroupConcatCtx *pGCC;
  char *zVal;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  iVar1 = sqlite3_value_type(*argv);
  if ((iVar1 != 5) &&
     (p = (sqlite3_str *)sqlite3_aggregate_context(context,0x30), p != (sqlite3_str *)0x0)) {
    psVar2 = sqlite3_context_db_handle(context);
    bVar4 = p->mxAlloc == 0;
    p->mxAlloc = psVar2->aLimit[0];
    if (argc == 1) {
      if (bVar4) {
        *(undefined4 *)((long)&p[1].db + 4) = 1;
      }
      else {
        sqlite3_str_appendchar(p,1,',');
      }
    }
    else if (bVar4) {
      iVar1 = sqlite3_value_bytes(argv[1]);
      *(int *)((long)&p[1].db + 4) = iVar1;
    }
    else {
      puVar3 = sqlite3_value_text(argv[1]);
      db._0_4_ = sqlite3_value_bytes(argv[1]);
      if (puVar3 == (uchar *)0x0) {
        db._0_4_ = 0;
      }
      else {
        sqlite3_str_append(p,(char *)puVar3,(int)db);
      }
      if (((int)db != *(int *)((long)&p[1].db + 4)) || (p[1].zText != (char *)0x0)) {
        if (p[1].zText == (char *)0x0) {
          _nA = (char *)sqlite3_malloc64((long)(*(int *)&p[1].db + 1) << 2);
          if (_nA != (char *)0x0) {
            local_5c = 0;
            iVar1 = *(int *)&p[1].db;
            while (local_5c < iVar1 + -1) {
              *(undefined4 *)(_nA + (long)local_5c * 4) = *(undefined4 *)((long)&p[1].db + 4);
              local_5c = local_5c + 1;
            }
          }
        }
        else {
          _nA = (char *)sqlite3_realloc64(p[1].zText,(long)*(int *)&p[1].db << 2);
        }
        if (_nA == (char *)0x0) {
          sqlite3StrAccumSetError(p,'\a');
        }
        else {
          if (0 < *(int *)&p[1].db) {
            *(int *)(_nA + (long)(*(int *)&p[1].db + -1) * 4) = (int)db;
          }
          p[1].zText = _nA;
        }
      }
    }
    *(int *)&p[1].db = *(int *)&p[1].db + 1;
    puVar3 = sqlite3_value_text(*argv);
    iVar1 = sqlite3_value_bytes(*argv);
    if (puVar3 != (uchar *)0x0) {
      sqlite3_str_append(p,(char *)puVar3,iVar1);
    }
  }
  return;
}

Assistant:

static void groupConcatStep(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const char *zVal;
  GroupConcatCtx *pGCC;
  const char *zSep;
  int nVal, nSep;
  assert( argc==1 || argc==2 );
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  pGCC = (GroupConcatCtx*)sqlite3_aggregate_context(context, sizeof(*pGCC));
  if( pGCC ){
    sqlite3 *db = sqlite3_context_db_handle(context);
    int firstTerm = pGCC->str.mxAlloc==0;
    pGCC->str.mxAlloc = db->aLimit[SQLITE_LIMIT_LENGTH];
    if( argc==1 ){
      if( !firstTerm ){
        sqlite3_str_appendchar(&pGCC->str, 1, ',');
      }
#ifndef SQLITE_OMIT_WINDOWFUNC
      else{
        pGCC->nFirstSepLength = 1;
      }
#endif
    }else if( !firstTerm ){
      zSep = (char*)sqlite3_value_text(argv[1]);
      nSep = sqlite3_value_bytes(argv[1]);
      if( zSep ){
        sqlite3_str_append(&pGCC->str, zSep, nSep);
      }
#ifndef SQLITE_OMIT_WINDOWFUNC
      else{
        nSep = 0;
      }
      if( nSep != pGCC->nFirstSepLength || pGCC->pnSepLengths != 0 ){
        int *pnsl = pGCC->pnSepLengths;
        if( pnsl == 0 ){
          /* First separator length variation seen, start tracking them. */
          pnsl = (int*)sqlite3_malloc64((pGCC->nAccum+1) * sizeof(int));
          if( pnsl!=0 ){
            int i = 0, nA = pGCC->nAccum-1;
            while( i<nA ) pnsl[i++] = pGCC->nFirstSepLength;
          }
        }else{
          pnsl = (int*)sqlite3_realloc64(pnsl, pGCC->nAccum * sizeof(int));
        }
        if( pnsl!=0 ){
          if( ALWAYS(pGCC->nAccum>0) ){
            pnsl[pGCC->nAccum-1] = nSep;
          }
          pGCC->pnSepLengths = pnsl;
        }else{
          sqlite3StrAccumSetError(&pGCC->str, SQLITE_NOMEM);
        }
      }
#endif
    }
#ifndef SQLITE_OMIT_WINDOWFUNC
    else{
      pGCC->nFirstSepLength = sqlite3_value_bytes(argv[1]);
    }
    pGCC->nAccum += 1;
#endif
    zVal = (char*)sqlite3_value_text(argv[0]);
    nVal = sqlite3_value_bytes(argv[0]);
    if( zVal ) sqlite3_str_append(&pGCC->str, zVal, nVal);
  }
}